

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void LowerBinaryOperationIntoBlock
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,VmInstruction *inst,uchar lhsReg,RegVmInstructionCode iCode,
               RegVmInstructionCode dCode,RegVmInstructionCode lCode)

{
  VmValueType VVar1;
  uchar uVar2;
  byte bVar3;
  uint uVar4;
  VmValue **ppVVar5;
  uchar targetReg_1;
  uchar rhsReg;
  uchar targetReg;
  uint constantIndex;
  VmValueType lhsType;
  RegVmInstructionCode iCode_local;
  uchar lhsReg_local;
  VmInstruction *inst_local;
  RegVmLoweredBlock *lowBlock_local;
  RegVmLoweredFunction *lowFunction_local;
  ExpressionContext *ctx_local;
  
  ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
  VVar1 = ((*ppVVar5)->type).type;
  ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,1);
  uVar4 = TryLowerConstantToMemory(lowBlock,*ppVVar5);
  if (uVar4 == 0) {
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,1);
    bVar3 = GetArgumentRegister(ctx,lowFunction,lowBlock,*ppVVar5);
    uVar2 = RegVmLoweredFunction::AllocateRegister(lowFunction,&inst->super_VmValue,0,true);
    if (VVar1 == VM_TYPE_INT) {
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,(inst->super_VmValue).source,iCode,uVar2,lhsReg,'\x03',
                 (uint)bVar3 << 3);
    }
    else if ((VVar1 == VM_TYPE_DOUBLE) && (dCode != rviNop)) {
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,(inst->super_VmValue).source,dCode,uVar2,lhsReg,'\x03',
                 (uint)bVar3 << 3);
    }
    else {
      if ((VVar1 != VM_TYPE_LONG) && (VVar1 != VM_TYPE_POINTER)) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x2a9,
                      "void LowerBinaryOperationIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmInstruction *, unsigned char, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode)"
                     );
      }
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,(inst->super_VmValue).source,lCode,uVar2,lhsReg,'\x03',
                 (uint)bVar3 << 3);
    }
  }
  else {
    uVar2 = RegVmLoweredFunction::AllocateRegister(lowFunction,&inst->super_VmValue,0,true);
    if (VVar1 == VM_TYPE_INT) {
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,(inst->super_VmValue).source,iCode,uVar2,lhsReg,'\x02',(uVar4 - 1) * 4
                );
    }
    else if ((VVar1 == VM_TYPE_DOUBLE) && (dCode != rviNop)) {
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,(inst->super_VmValue).source,dCode,uVar2,lhsReg,'\x02',(uVar4 - 1) * 4
                );
    }
    else {
      if ((VVar1 != VM_TYPE_LONG) && (VVar1 != VM_TYPE_POINTER)) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x29b,
                      "void LowerBinaryOperationIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmInstruction *, unsigned char, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode)"
                     );
      }
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,(inst->super_VmValue).source,lCode,uVar2,lhsReg,'\x02',(uVar4 - 1) * 4
                );
    }
  }
  return;
}

Assistant:

void LowerBinaryOperationIntoBlock(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmInstruction *inst, unsigned char lhsReg, RegVmInstructionCode iCode, RegVmInstructionCode dCode, RegVmInstructionCode lCode)
{
	VmValueType lhsType = inst->arguments[0]->type.type;

	if(unsigned constantIndex = TryLowerConstantToMemory(lowBlock, inst->arguments[1]))
	{
		unsigned char targetReg = lowFunction->AllocateRegister(inst);

		if(lhsType == VM_TYPE_INT || (lhsType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4))
			lowBlock->AddInstruction(ctx, inst->source, iCode, targetReg, lhsReg, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
		else if(lhsType == VM_TYPE_DOUBLE && dCode != rviNop)
			lowBlock->AddInstruction(ctx, inst->source, dCode, targetReg, lhsReg, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
		else if(lhsType == VM_TYPE_LONG || (lhsType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8))
			lowBlock->AddInstruction(ctx, inst->source, lCode, targetReg, lhsReg, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
		else
			assert(!"unknown type");
	}
	else
	{
		unsigned char rhsReg = GetArgumentRegister(ctx, lowFunction, lowBlock, inst->arguments[1]);
		unsigned char targetReg = lowFunction->AllocateRegister(inst);

		if(lhsType == VM_TYPE_INT || (lhsType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4))
			lowBlock->AddInstruction(ctx, inst->source, iCode, targetReg, lhsReg, rvrrRegisters, rhsReg * sizeof(RegVmRegister));
		else if(lhsType == VM_TYPE_DOUBLE && dCode != rviNop)
			lowBlock->AddInstruction(ctx, inst->source, dCode, targetReg, lhsReg, rvrrRegisters, rhsReg * sizeof(RegVmRegister));
		else if(lhsType == VM_TYPE_LONG || (lhsType == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8))
			lowBlock->AddInstruction(ctx, inst->source, lCode, targetReg, lhsReg, rvrrRegisters, rhsReg * sizeof(RegVmRegister));
		else
			assert(!"unknown type");
	}
}